

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::getRSAPublicKey(SoftHSM *this,RSAPublicKey *publicKey,Token *token,OSObject *key)

{
  int iVar1;
  undefined1 uVar2;
  undefined7 uVar3;
  uchar *in_R8;
  size_t in_R9;
  CK_RV CVar4;
  ByteString local_a0;
  ByteString publicExponent;
  ByteString modulus;
  
  uVar3 = (undefined7)((ulong)key >> 8);
  uVar2 = token == (Token *)0x0 || publicKey == (RSAPublicKey *)0x0;
  if (key == (OSObject *)0x0 || (token == (Token *)0x0 || publicKey == (RSAPublicKey *)0x0)) {
    return 7;
  }
  iVar1 = (*key->_vptr_OSObject[4])(key,2,0);
  ByteString::ByteString(&modulus);
  ByteString::ByteString(&publicExponent);
  if ((char)iVar1 == '\0') {
    (*key->_vptr_OSObject[6])(&local_a0,key,0x120);
    ByteString::operator=(&modulus,&local_a0);
    ByteString::~ByteString(&local_a0);
    (*key->_vptr_OSObject[6])(&local_a0,key,0x122);
    ByteString::operator=(&publicExponent,&local_a0);
    ByteString::~ByteString(&local_a0);
  }
  else {
    (*key->_vptr_OSObject[6])(&local_a0,key,0x120);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_a0,(uchar *)&modulus,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    ByteString::~ByteString(&local_a0);
    CVar4 = 5;
    if ((char)iVar1 == '\0') goto LAB_00131dab;
    (*key->_vptr_OSObject[6])(&local_a0,key,0x122);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_a0,(uchar *)&publicExponent,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    ByteString::~ByteString(&local_a0);
    if ((char)iVar1 == '\0') goto LAB_00131dab;
  }
  (**(code **)(*(long *)publicKey + 0x30))(publicKey,&modulus);
  (**(code **)(*(long *)publicKey + 0x38))(publicKey,&publicExponent);
  CVar4 = 0;
LAB_00131dab:
  ByteString::~ByteString(&publicExponent);
  ByteString::~ByteString(&modulus);
  return CVar4;
}

Assistant:

CK_RV SoftHSM::getRSAPublicKey(RSAPublicKey* publicKey, Token* token, OSObject* key)
{
	if (publicKey == NULL) return CKR_ARGUMENTS_BAD;
	if (token == NULL) return CKR_ARGUMENTS_BAD;
	if (key == NULL) return CKR_ARGUMENTS_BAD;

	// Get the CKA_PRIVATE attribute, when the attribute is not present use default false
	bool isKeyPrivate = key->getBooleanValue(CKA_PRIVATE, false);

	// RSA Public Key Attributes
	ByteString modulus;
	ByteString publicExponent;
	if (isKeyPrivate)
	{
		bool bOK = true;
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_MODULUS), modulus);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_PUBLIC_EXPONENT), publicExponent);
		if (!bOK)
			return CKR_GENERAL_ERROR;
	}
	else
	{
		modulus = key->getByteStringValue(CKA_MODULUS);
		publicExponent = key->getByteStringValue(CKA_PUBLIC_EXPONENT);
	}

	publicKey->setN(modulus);
	publicKey->setE(publicExponent);

	return CKR_OK;
}